

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VTable * vtabDisconnectAll(sqlite3 *db,Table *p)

{
  sqlite3 *psVar1;
  sqlite3 *psVar2;
  VTable *pNext;
  sqlite3 *db2;
  VTable *pVTable;
  VTable *pRet;
  Table *p_local;
  sqlite3 *db_local;
  
  pVTable = (VTable *)0x0;
  db2 = (sqlite3 *)p->pVTable;
  p->pVTable = (VTable *)0x0;
  while (db2 != (sqlite3 *)0x0) {
    psVar1 = (sqlite3 *)db2->pVfs;
    psVar2 = *(sqlite3 **)&db2->nDb;
    if (psVar1 == db) {
      pVTable = (VTable *)db2;
      p->pVTable = (VTable *)db2;
      db2->nDb = 0;
      db2->flags = 0;
      db2 = psVar2;
    }
    else {
      *(VTable **)&db2->nDb = psVar1->pDisconnect;
      psVar1->pDisconnect = (VTable *)db2;
      db2 = psVar2;
    }
  }
  return pVTable;
}

Assistant:

static VTable *vtabDisconnectAll(sqlite3 *db, Table *p){
  VTable *pRet = 0;
  VTable *pVTable = p->pVTable;
  p->pVTable = 0;

  /* Assert that the mutex (if any) associated with the BtShared database 
  ** that contains table p is held by the caller. See header comments 
  ** above function sqlite3VtabUnlockList() for an explanation of why
  ** this makes it safe to access the sqlite3.pDisconnect list of any
  ** database connection that may have an entry in the p->pVTable list.
  */
  assert( db==0 || sqlite3SchemaMutexHeld(db, 0, p->pSchema) );

  while( pVTable ){
    sqlite3 *db2 = pVTable->db;
    VTable *pNext = pVTable->pNext;
    assert( db2 );
    if( db2==db ){
      pRet = pVTable;
      p->pVTable = pRet;
      pRet->pNext = 0;
    }else{
      pVTable->pNext = db2->pDisconnect;
      db2->pDisconnect = pVTable;
    }
    pVTable = pNext;
  }

  assert( !db || pRet );
  return pRet;
}